

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCore.c
# Opt level: O0

int Xyz_ManPerform(Aig_Man_t *pAig,Xyz_ParTry_t *pPar)

{
  Xyz_ManTry_t *p_00;
  int RetValue;
  Xyz_ManTry_t *p;
  Xyz_ParTry_t *pPar_local;
  Aig_Man_t *pAig_local;
  
  p_00 = Xyz_ManTryAlloc(pAig,pPar);
  Xyz_ManTryFree(p_00);
  return 1;
}

Assistant:

int Xyz_ManPerform( Aig_Man_t * pAig, Xyz_ParTry_t * pPar )
{
    Xyz_ManTry_t * p;
    int RetValue;
    p = Xyz_ManTryAlloc( pAig, pPar );
    RetValue = 1;
    Xyz_ManTryFree( p );
    return RetValue;
}